

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_conf_dh_param_ctx(mbedtls_ssl_config *conf,mbedtls_dhm_context *dhm_ctx)

{
  int local_24;
  int ret;
  mbedtls_dhm_context *dhm_ctx_local;
  mbedtls_ssl_config *conf_local;
  
  local_24 = mbedtls_mpi_copy(&conf->dhm_P,&dhm_ctx->P);
  if ((local_24 == 0) && (local_24 = mbedtls_mpi_copy(&conf->dhm_G,&dhm_ctx->G), local_24 == 0)) {
    return 0;
  }
  mbedtls_mpi_free(&conf->dhm_P);
  mbedtls_mpi_free(&conf->dhm_G);
  return local_24;
}

Assistant:

int mbedtls_ssl_conf_dh_param_ctx( mbedtls_ssl_config *conf, mbedtls_dhm_context *dhm_ctx )
{
    int ret;

    if( ( ret = mbedtls_mpi_copy( &conf->dhm_P, &dhm_ctx->P ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &conf->dhm_G, &dhm_ctx->G ) ) != 0 )
    {
        mbedtls_mpi_free( &conf->dhm_P );
        mbedtls_mpi_free( &conf->dhm_G );
        return( ret );
    }

    return( 0 );
}